

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase58::run(TestCase58 *this)

{
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  Reader reader_00;
  Builder root;
  Builder local_160;
  Reader local_130;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = root._builder.dataSize;
  builder_00._builder.pointerCount = root._builder.pointerCount;
  builder_00._builder._38_2_ = root._builder._38_2_;
  initTestMessage(builder_00);
  StructBuilder::asReader(&root._builder);
  reader.reader.segment = (SegmentReader *)local_160.schema.super_Schema.raw;
  reader.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x662308;
  reader.reader.capTable = (CapTableReader *)local_160.builder.segment;
  reader.reader.data = local_160.builder.capTable;
  reader.reader.pointers = (WirePointer *)local_160.builder.data;
  reader.reader._32_8_ = local_160.builder.pointers;
  reader.reader.nestingLimit = local_160.builder.dataSize;
  reader.reader._44_2_ = local_160.builder.pointerCount;
  reader.reader._46_2_ = local_160.builder._38_2_;
  checkDynamicTestMessage(reader);
  local_160.builder.dataSize = root._builder.dataSize;
  local_160.builder.pointerCount = root._builder.pointerCount;
  local_160.builder._38_2_ = root._builder._38_2_;
  local_160.builder.data = root._builder.data;
  local_160.builder.pointers = root._builder.pointers;
  local_160.builder.segment = root._builder.segment;
  local_160.builder.capTable = root._builder.capTable;
  local_160.schema.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  DynamicStruct::Builder::asReader(&local_130,&local_160);
  reader_00.reader.segment = local_130.reader.segment;
  reader_00.schema.super_Schema.raw = local_130.schema.super_Schema.raw;
  reader_00.reader.capTable = local_130.reader.capTable;
  reader_00.reader.data = local_130.reader.data;
  reader_00.reader.pointers = local_130.reader.pointers;
  reader_00.reader.dataSize = local_130.reader.dataSize;
  reader_00.reader.pointerCount = local_130.reader.pointerCount;
  reader_00.reader._38_2_ = local_130.reader._38_2_;
  reader_00.reader.nestingLimit = local_130.reader.nestingLimit;
  reader_00.reader._44_4_ = local_130.reader._44_4_;
  checkDynamicTestMessage(reader_00);
  builder_01.builder.segment = root._builder.segment;
  builder_01.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x662308;
  builder_01.builder.capTable = root._builder.capTable;
  builder_01.builder.data = root._builder.data;
  builder_01.builder.pointers = root._builder.pointers;
  builder_01.builder.dataSize = root._builder.dataSize;
  builder_01.builder.pointerCount = root._builder.pointerCount;
  builder_01.builder._38_2_ = root._builder._38_2_;
  checkDynamicTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(DynamicApi, Read) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  initTestMessage(root);

  checkDynamicTestMessage(toDynamic(root.asReader()));
  checkDynamicTestMessage(toDynamic(root).asReader());
  checkDynamicTestMessage(toDynamic(root));
}